

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DecorationManager::RemoveDecoration
          (DecorationManager *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  int iVar3;
  uint32_t uVar4;
  pointer ppVar5;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_70;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_68;
  iterator iter_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  _Stack_58;
  uint32_t group_id;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_50;
  iterator iter_2;
  uint local_40;
  uint32_t target_id_1;
  uint32_t i;
  uint32_t stride;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_30;
  iterator iter;
  anon_class_8_1_898d1344 aStack_20;
  uint32_t target_id;
  anon_class_8_1_898d1344 remove_from_container;
  Instruction *inst_local;
  DecorationManager *this_local;
  
  aStack_20.inst = inst;
  remove_from_container.inst = inst;
  OVar2 = opt::Instruction::opcode(inst);
  if (1 < OVar2 - OpDecorate) {
    if (OVar2 - OpGroupDecorate < 2) {
      OVar2 = opt::Instruction::opcode(remove_from_container.inst);
      iVar3 = 2;
      if (OVar2 == OpGroupDecorate) {
        iVar3 = 1;
      }
      for (local_40 = 1; uVar4 = opt::Instruction::NumInOperands(remove_from_container.inst),
          local_40 < uVar4; local_40 = iVar3 + local_40) {
        iter_2.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
        ._M_cur._4_4_ =
             opt::Instruction::GetSingleWordInOperand(remove_from_container.inst,local_40);
        local_50._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
             ::find(&this->id_to_decoration_insts_,
                    (key_type *)
                    ((long)&iter_2.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                            ._M_cur + 4));
        _Stack_58._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
             ::end(&this->id_to_decoration_insts_);
        bVar1 = std::__detail::operator==(&local_50,&stack0xffffffffffffffa8);
        if (!bVar1) {
          ppVar5 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                                 *)&local_50);
          RemoveDecoration::anon_class_8_1_898d1344::operator()
                    (&stack0xffffffffffffffe0,&(ppVar5->second).indirect_decorations);
        }
      }
      iter_1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
      ._M_cur._4_4_ = opt::Instruction::GetSingleWordInOperand(remove_from_container.inst,0);
      local_68._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
           ::find(&this->id_to_decoration_insts_,
                  (key_type *)
                  ((long)&iter_1.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          ._M_cur + 4));
      local_70._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
           ::end(&this->id_to_decoration_insts_);
      bVar1 = std::__detail::operator==(&local_68,&local_70);
      if (bVar1) {
        return;
      }
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                             *)&local_68);
      RemoveDecoration::anon_class_8_1_898d1344::operator()
                (&stack0xffffffffffffffe0,&(ppVar5->second).decorate_insts);
      return;
    }
    if ((OVar2 != OpDecorateId) && (OVar2 != OpDecorateString)) {
      return;
    }
  }
  iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  ._M_cur._4_4_ = opt::Instruction::GetSingleWordInOperand(remove_from_container.inst,0);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
       ::find(&this->id_to_decoration_insts_,
              (key_type *)
              ((long)&iter.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      ._M_cur + 4));
  _i = (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
       ::end(&this->id_to_decoration_insts_);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      *)&i);
  if (!bVar1) {
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                           *)&local_30);
    RemoveDecoration::anon_class_8_1_898d1344::operator()
              (&stack0xffffffffffffffe0,&(ppVar5->second).direct_decorations);
  }
  return;
}

Assistant:

void DecorationManager::RemoveDecoration(Instruction* inst) {
  const auto remove_from_container = [inst](std::vector<Instruction*>& v) {
    v.erase(std::remove(v.begin(), v.end(), inst), v.end());
  };

  switch (inst->opcode()) {
    case spv::Op::OpDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
    case spv::Op::OpMemberDecorate: {
      const auto target_id = inst->GetSingleWordInOperand(0u);
      auto const iter = id_to_decoration_insts_.find(target_id);
      if (iter == id_to_decoration_insts_.end()) return;
      remove_from_container(iter->second.direct_decorations);
    } break;
    case spv::Op::OpGroupDecorate:
    case spv::Op::OpGroupMemberDecorate: {
      const uint32_t stride =
          inst->opcode() == spv::Op::OpGroupDecorate ? 1u : 2u;
      for (uint32_t i = 1u; i < inst->NumInOperands(); i += stride) {
        const auto target_id = inst->GetSingleWordInOperand(i);
        auto const iter = id_to_decoration_insts_.find(target_id);
        if (iter == id_to_decoration_insts_.end()) continue;
        remove_from_container(iter->second.indirect_decorations);
      }
      const auto group_id = inst->GetSingleWordInOperand(0u);
      auto const iter = id_to_decoration_insts_.find(group_id);
      if (iter == id_to_decoration_insts_.end()) return;
      remove_from_container(iter->second.decorate_insts);
    } break;
    default:
      break;
  }
}